

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

U32 ZSTD_rawLiteralsCost_cached
              (cachedLiteralPrice_t *cachedLitPrice,BYTE *anchor,U32 litlen,optState_t *optStatePtr)

{
  U32 UVar1;
  undefined8 in_RCX;
  int in_EDX;
  long in_RSI;
  long *in_RDI;
  U32 rawLitCost;
  BYTE *startPosition;
  U32 remainingLength;
  U32 startCost;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (in_RSI == *in_RDI) {
    iVar3 = *(int *)((long)in_RDI + 0xc);
    iVar2 = in_EDX - (int)in_RDI[1];
  }
  else {
    iVar3 = 0;
    iVar2 = in_EDX;
  }
  UVar1 = ZSTD_rawLiteralsCost
                    ((BYTE *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(U32)((ulong)in_RCX >> 0x20)
                     ,(optState_t *)CONCAT44(iVar3,iVar2));
  *in_RDI = in_RSI;
  *(int *)(in_RDI + 1) = in_EDX;
  *(U32 *)((long)in_RDI + 0xc) = iVar3 + UVar1;
  return iVar3 + UVar1;
}

Assistant:

static U32 ZSTD_rawLiteralsCost_cached(
                            cachedLiteralPrice_t* const cachedLitPrice,
                            const BYTE* const anchor, U32 const litlen,
                            const optState_t* const optStatePtr)
{
    U32 startCost;
    U32 remainingLength;
    const BYTE* startPosition;

    if (anchor == cachedLitPrice->anchor) {
        startCost = cachedLitPrice->rawLitCost;
        startPosition = anchor + cachedLitPrice->litlen;
        assert(litlen >= cachedLitPrice->litlen);
        remainingLength = litlen - cachedLitPrice->litlen;
    } else {
        startCost = 0;
        startPosition = anchor;
        remainingLength = litlen;
    }

    {   U32 const rawLitCost = startCost + ZSTD_rawLiteralsCost(startPosition, remainingLength, optStatePtr);
        cachedLitPrice->anchor = anchor;
        cachedLitPrice->litlen = litlen;
        cachedLitPrice->rawLitCost = rawLitCost;
        return rawLitCost;
    }
}